

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::WeightParams::Clear(WeightParams *this)

{
  ulong uVar1;
  QuantizationParams *this_00;
  undefined8 *puVar2;
  
  (this->floatvalue_).current_size_ = 0;
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->float16value_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->rawvalue_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->int8rawvalue_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->quantization_, this_00 != (QuantizationParams *)0x0)) {
    QuantizationParams::~QuantizationParams(this_00);
    operator_delete(this_00,0x28);
  }
  this->quantization_ = (QuantizationParams *)0x0;
  this->isupdatable_ = false;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void WeightParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.WeightParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  floatvalue_.Clear();
  float16value_.ClearToEmpty();
  rawvalue_.ClearToEmpty();
  int8rawvalue_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && quantization_ != nullptr) {
    delete quantization_;
  }
  quantization_ = nullptr;
  isupdatable_ = false;
  _internal_metadata_.Clear<std::string>();
}